

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_15::JUnitReporter::JUnitTestCaseData::appendSubcaseNamesToLastTestcase
          (JUnitTestCaseData *this,
          vector<doctest::String,_std::allocator<doctest::String>_> *nameStack)

{
  bool bVar1;
  size_type sVar2;
  char *__rhs;
  reference pvVar3;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  reference local_38;
  String *curr;
  iterator __end3;
  iterator __begin3;
  vector<doctest::String,_std::allocator<doctest::String>_> *__range3;
  vector<doctest::String,_std::allocator<doctest::String>_> *nameStack_local;
  JUnitTestCaseData *this_local;
  
  __end3 = std::vector<doctest::String,_std::allocator<doctest::String>_>::begin(nameStack);
  curr = (String *)std::vector<doctest::String,_std::allocator<doctest::String>_>::end(nameStack);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<doctest::String_*,_std::vector<doctest::String,_std::allocator<doctest::String>_>_>
                                *)&curr);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<doctest::String_*,_std::vector<doctest::String,_std::allocator<doctest::String>_>_>
               ::operator*(&__end3);
    sVar2 = String::size(local_38);
    if (sVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"/",&local_79);
      __rhs = String::c_str(local_38);
      std::operator+(&local_58,&local_78,__rhs);
      pvVar3 = std::
               vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
               ::back(&this->testcases);
      std::__cxx11::string::operator+=((string *)&pvVar3->name,(string *)&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
    }
    __gnu_cxx::
    __normal_iterator<doctest::String_*,_std::vector<doctest::String,_std::allocator<doctest::String>_>_>
    ::operator++(&__end3);
  }
  return;
}

Assistant:

void appendSubcaseNamesToLastTestcase(std::vector<String> nameStack) {
                for(auto& curr: nameStack)
                    if(curr.size())
                        testcases.back().name += std::string("/") + curr.c_str();
            }